

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t canZstd(void)

{
  wchar_t wVar1;
  
  if (canZstd::tested == L'\0') {
    canZstd::tested = L'\x01';
    wVar1 = systemf("zstd --help %s",redirectArgs);
    if (wVar1 == L'\0') {
      canZstd::value = L'\x01';
    }
  }
  return canZstd::value;
}

Assistant:

int
canZstd(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("zstd --help %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}